

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_php_type_spec(t_php_generator *this,ostream *out,t_type *t)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  t_type *ptVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  t_type *type;
  undefined8 *puVar6;
  char *pcVar7;
  string local_58;
  t_type *local_38;
  
  ptVar4 = t_type::get_true_type(t);
  poVar5 = t_generator::indent((t_generator *)this,out);
  pcVar7 = "\'type\' => ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'type\' => ",10);
  type_to_enum_abi_cxx11_(&local_58,(t_php_generator *)pcVar7,ptVar4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[5])(ptVar4);
  if ((char)iVar3 == '\0') {
    iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xb])(ptVar4);
    if ((((char)iVar3 == '\0') &&
        (iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xc])(ptVar4), (char)iVar3 == '\0')) &&
       (iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[10])(ptVar4), (char)iVar3 == '\0')) {
      iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0x10])(ptVar4);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xe])(ptVar4);
        if (((char)iVar3 == '\0') &&
           (iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xf])(ptVar4), (char)iVar3 == '\0')) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = "compiler error: no type for php struct spec field";
          __cxa_throw(puVar6,&char_const*::typeinfo,0);
        }
        (*(ptVar4->super_t_doc)._vptr_t_doc[0xe])(ptVar4);
        ptVar4 = t_type::get_true_type(*(t_type **)&ptVar4[1].super_t_doc.has_doc_);
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar7 = "\'etype\' => ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'etype\' => ",0xb);
        type_to_enum_abi_cxx11_(&local_58,(t_php_generator *)pcVar7,ptVar4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'elem\' => array(",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,ptVar4);
        poVar5 = t_generator::indent((t_generator *)this,out);
      }
      else {
        type = t_type::get_true_type(*(t_type **)&ptVar4[1].super_t_doc.has_doc_);
        local_38 = t_type::get_true_type(*(t_type **)&ptVar4[1].annotations_._M_t._M_impl);
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar7 = "\'ktype\' => ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'ktype\' => ",0xb);
        type_to_enum_abi_cxx11_(&local_58,(t_php_generator *)pcVar7,type);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        poVar5 = t_generator::indent((t_generator *)this,out);
        pcVar7 = "\'vtype\' => ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'vtype\' => ",0xb);
        type_to_enum_abi_cxx11_(&local_58,(t_php_generator *)pcVar7,local_38);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'key\' => array(",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,type);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"),",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'val\' => array(",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        generate_php_type_spec(this,out,local_38);
        poVar5 = t_generator::indent((t_generator *)this,out);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"),",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      return;
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\'class\' => \'",0xc);
    php_namespace_abi_cxx11_(&local_58,this,ptVar4->program_);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
    iVar3 = (*(ptVar4->super_t_doc)._vptr_t_doc[3])(ptVar4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var,iVar3),
                        ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\',",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void t_php_generator::generate_php_type_spec(ostream& out, t_type* t) {
  t = get_true_type(t);
  indent(out) << "'type' => " << type_to_enum(t) << "," << endl;

  if (t->is_base_type()) {
    // Noop, type is all we need
  } else if (t->is_struct() || t->is_xception() || t->is_enum()) {
    indent(out) << "'class' => '" << php_namespace(t->get_program()) << t->get_name() << "',"
                << endl;
  } else if (t->is_map()) {
    t_type* ktype = get_true_type(((t_map*)t)->get_key_type());
    t_type* vtype = get_true_type(((t_map*)t)->get_val_type());
    indent(out) << "'ktype' => " << type_to_enum(ktype) << "," << endl;
    indent(out) << "'vtype' => " << type_to_enum(vtype) << "," << endl;
    indent(out) << "'key' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, ktype);
    indent_down();
    indent(out) << ")," << endl;
    indent(out) << "'val' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, vtype);
    indent(out) << ")," << endl;
    indent_down();
  } else if (t->is_list() || t->is_set()) {
    t_type* etype;
    if (t->is_list()) {
      etype = get_true_type(((t_list*)t)->get_elem_type());
    } else {
      etype = get_true_type(((t_set*)t)->get_elem_type());
    }
    indent(out) << "'etype' => " << type_to_enum(etype) << "," << endl;
    indent(out) << "'elem' => array(" << endl;
    indent_up();
    generate_php_type_spec(out, etype);
    indent(out) << ")," << endl;
    indent_down();
  } else {
    throw "compiler error: no type for php struct spec field";
  }
}